

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType1.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::GridDataType1::Decode(GridDataType1 *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  ushort local_52;
  unsigned_short local_50;
  undefined1 local_4d;
  KUINT16 i;
  KUINT16 tmp;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  GridDataType1 *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0xe) {
    local_4d = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    local_4d = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear(&this->m_vui16Values);
  GridData::Decode(&this->super_GridData,local_18);
  pKVar2 = KDataStream::operator>>(local_18,(float *)&(this->super_GridData).field_0xc);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32FieldOffset);
  KDataStream::operator>>(pKVar2,&this->m_ui16NumValues);
  local_50 = 0;
  for (local_52 = 0; local_52 < this->m_ui16NumValues; local_52 = local_52 + 1) {
    KDataStream::operator>>(local_18,&local_50);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (&this->m_vui16Values,&local_50);
  }
  if ((uint)this->m_ui16NumValues % 2 == 1) {
    KDataStream::operator>>(local_18,&this->m_ui16Padding);
  }
  return;
}

Assistant:

void GridDataType1::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GRID_DATA_TYPE1_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vui16Values.clear();

    GridData::Decode( stream );

    stream >> m_f32FieldScale
           >> m_f32FieldOffset
           >> m_ui16NumValues;

    KUINT16 tmp = 0;
    for( KUINT16 i = 0; i < m_ui16NumValues; ++i )
    {
        stream >> tmp;
        m_vui16Values.push_back( tmp );
    }

    // Do we need to extract any padding?
    if( m_ui16NumValues % 2 == 1 )
    {
        stream >> m_ui16Padding;
    }
}